

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

Error * ot::commissioner::Commissioner::GeneratePSKc
                  (Error *__return_storage_ptr__,ByteArray *aPSKc,string *aPassphrase,
                  string *aNetworkName,ByteArray *aExtendedPanId)

{
  pointer pcVar1;
  uint8_t *aKey;
  char *pcVar2;
  char *pcVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *pcVar4;
  bool bVar5;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  ByteArray salt;
  string saltPrefix;
  writer write;
  string local_118;
  uint8_t *local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  string *local_d8;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  ErrorCode local_b0;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  writer local_80;
  undefined1 local_78 [16];
  char *local_68;
  size_t local_60;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  *local_58;
  format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *local_50;
  code *local_48;
  code *pcStack_40;
  code *local_38;
  
  __return_storage_ptr__->mCode = kNone;
  local_88 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_88;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Thread","");
  local_f8 = (uint8_t *)0x0;
  uStack_f0 = 0;
  local_e8 = 0;
  local_d8 = aPassphrase;
  if (aPassphrase->_M_string_length - 6 < 0xfa) {
    if (aNetworkName->_M_string_length < 0x11) {
      if ((long)(aExtendedPanId->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(aExtendedPanId->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_start == 8) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_f8,0,local_d0,
                   local_d0 + local_c8);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_f8,uStack_f0,
                   (aExtendedPanId->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start,
                   (aExtendedPanId->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish);
        pcVar1 = (aNetworkName->_M_dataplus)._M_p;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_f8,uStack_f0,pcVar1
                   ,pcVar1 + aNetworkName->_M_string_length);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(aPSKc,0x10);
        aKey = (aPSKc->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
        otPbkdf2Cmac((uint8_t *)(local_d8->_M_dataplus)._M_p,(uint16_t)local_d8->_M_string_length,
                     local_f8,(short)uStack_f0 - (short)local_f8,0x4000,
                     (short)*(undefined4 *)
                             &(aPSKc->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (short)aKey,aKey);
        goto LAB_001b7528;
      }
      local_78._0_4_ = ulong_long_type;
      local_78._4_4_ = ulong_long_type;
      local_78._8_8_ = "extended PAN ID length={} != {}";
      local_68 = (char *)0x1f;
      local_60 = 0x200000000;
      local_50 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                 ::fmt::v10::detail::
                 parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
      local_48 = ::fmt::v10::detail::
                 parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
      pcVar4 = "extended PAN ID length={} != {}";
      local_58 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
                  *)local_78;
      do {
        pcVar3 = pcVar4 + 1;
        if (*pcVar4 == '}') {
          if ((pcVar3 == "") || (*pcVar3 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar3 = pcVar4 + 2;
        }
        else if (*pcVar4 == '{') {
          pcVar3 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_long,unsigned_long>&>
                             (pcVar4,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
                               *)local_78);
        }
        pcVar4 = pcVar3;
      } while (pcVar3 != "");
      local_78._0_8_ =
           (long)(aExtendedPanId->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(aExtendedPanId->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
      local_68 = (char *)0x8;
      fmt_01.size_ = 0x44;
      fmt_01.data_ = (char *)0x1f;
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)local_78;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_118,(v10 *)"extended PAN ID length={} != {}",fmt_01,args_01);
      local_b0 = kInvalidArgs;
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a8,local_118._M_dataplus._M_p,
                 local_118._M_dataplus._M_p + local_118._M_string_length);
    }
    else {
      local_78._0_4_ = ulong_long_type;
      local_78._4_4_ = ulong_long_type;
      local_78._8_8_ = "network name length={} > {}";
      local_68 = (char *)0x1b;
      local_60 = 0x200000000;
      local_50 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                 ::fmt::v10::detail::
                 parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
      local_48 = ::fmt::v10::detail::
                 parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
      pcVar4 = "network name length={} > {}";
      local_58 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
                  *)local_78;
      do {
        pcVar3 = pcVar4 + 1;
        if (*pcVar4 == '}') {
          if ((pcVar3 == "") || (*pcVar3 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar3 = pcVar4 + 2;
        }
        else if (*pcVar4 == '{') {
          pcVar3 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_long,unsigned_long>&>
                             (pcVar4,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
                               *)local_78);
        }
        pcVar4 = pcVar3;
      } while (pcVar3 != "");
      local_78._0_8_ = aNetworkName->_M_string_length;
      local_68 = (char *)0x10;
      fmt_00.size_ = 0x44;
      fmt_00.data_ = (char *)0x1b;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_78;
      ::fmt::v10::vformat_abi_cxx11_(&local_118,(v10 *)"network name length={} > {}",fmt_00,args_00)
      ;
      local_b0 = kInvalidArgs;
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a8,local_118._M_dataplus._M_p,
                 local_118._M_dataplus._M_p + local_118._M_string_length);
    }
  }
  else {
    local_78._0_4_ = ulong_long_type;
    local_78._4_4_ = ulong_long_type;
    local_78._8_4_ = 4;
    pcVar4 = "passphrase length={} exceeds range [{}, {}]";
    local_68 = "passphrase length={} exceeds range [{}, {}]";
    local_60 = 0x2b;
    local_58 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
                *)0x300000000;
    local_48 = ::fmt::v10::detail::
               parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
    pcStack_40 = ::fmt::v10::detail::
                 parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
    local_38 = ::fmt::v10::detail::
               parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
    local_80.handler_ =
         (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)local_78;
    local_50 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)local_78;
    do {
      if (pcVar4 == "") break;
      pcVar3 = pcVar4;
      if (*pcVar4 == '{') {
LAB_001b7249:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long>_>
        ::writer::operator()(&local_80,pcVar4,pcVar3);
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_long,unsigned_long,unsigned_long>&>
                           (pcVar3,"",
                            (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long>
                             *)local_78);
        bVar5 = true;
      }
      else {
        pcVar3 = pcVar4 + 1;
        bVar5 = pcVar3 != "";
        if (bVar5) {
          if (*pcVar3 != '{') {
            pcVar2 = pcVar4 + 2;
            do {
              pcVar3 = pcVar2;
              bVar5 = pcVar3 != "";
              if (pcVar3 == "") goto LAB_001b7245;
              pcVar2 = pcVar3 + 1;
            } while (*pcVar3 != '{');
          }
          bVar5 = true;
        }
LAB_001b7245:
        if (bVar5) goto LAB_001b7249;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long>_>
        ::writer::operator()(&local_80,pcVar4,"");
        bVar5 = false;
      }
    } while (bVar5);
    local_78._0_8_ = local_d8->_M_string_length;
    local_68 = (char *)0x6;
    local_58 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
                *)0xff;
    fmt.size_ = 0x444;
    fmt.data_ = (char *)0x2b;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_78;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_118,(v10 *)"passphrase length={} exceeds range [{}, {}]",fmt,args);
    local_b0 = kInvalidArgs;
    local_a8[0] = local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a8,local_118._M_dataplus._M_p,
               local_118._M_dataplus._M_p + local_118._M_string_length);
  }
  __return_storage_ptr__->mCode = local_b0;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_a8);
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
LAB_001b7528:
  if (local_f8 != (uint8_t *)0x0) {
    operator_delete(local_f8);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Commissioner::GeneratePSKc(ByteArray         &aPSKc,
                                 const std::string &aPassphrase,
                                 const std::string &aNetworkName,
                                 const ByteArray   &aExtendedPanId)
{
    Error             error;
    const std::string saltPrefix = "Thread";
    ByteArray         salt;

    VerifyOrExit((aPassphrase.size() >= kMinCommissionerCredentialLength) &&
                     (aPassphrase.size() <= kMaxCommissionerCredentialLength),
                 error = ERROR_INVALID_ARGS("passphrase length={} exceeds range [{}, {}]", aPassphrase.size(),
                                            kMinCommissionerCredentialLength, kMaxCommissionerCredentialLength));
    VerifyOrExit(aNetworkName.size() <= kMaxNetworkNameLength,
                 error = ERROR_INVALID_ARGS("network name length={} > {}", aNetworkName.size(), kMaxNetworkNameLength));
    VerifyOrExit(
        aExtendedPanId.size() == kExtendedPanIdLength,
        error = ERROR_INVALID_ARGS("extended PAN ID length={} != {}", aExtendedPanId.size(), kExtendedPanIdLength));

    salt.insert(salt.end(), saltPrefix.begin(), saltPrefix.end());
    salt.insert(salt.end(), aExtendedPanId.begin(), aExtendedPanId.end());
    salt.insert(salt.end(), aNetworkName.begin(), aNetworkName.end());

    aPSKc.resize(kMaxPSKcLength);
    otPbkdf2Cmac(reinterpret_cast<const uint8_t *>(aPassphrase.data()), static_cast<uint16_t>(aPassphrase.size()),
                 salt.data(), static_cast<uint16_t>(salt.size()), 16384, static_cast<uint16_t>(aPSKc.size()),
                 aPSKc.data());

exit:
    return error;
}